

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScalableKReach.cpp
# Opt level: O3

bool __thiscall ScalableKReach::bfs(ScalableKReach *this,vertex_t s,vertex_t t)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  pointer puVar4;
  pointer puVar5;
  uint *puVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar7;
  const_iterator cVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint *nxt;
  uint *puVar14;
  ulong uVar15;
  uint local_40;
  uint local_3c;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_38;
  
  uVar9 = (ulong)s;
  this->back_ = 0;
  this->front_ = 0;
  puVar4 = (this->distance_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar10 = (long)(this->distance_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4;
  if (uVar9 < uVar10) {
    puVar4[uVar9] = '\0';
    uVar9 = this->back_;
    uVar13 = uVar9 + 1;
    this->back_ = uVar13;
    puVar5 = (this->queue_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = (long)(this->queue_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 2;
    if (uVar9 < uVar10) {
      puVar5[uVar9] = s;
      uVar12 = this->front_;
      uVar15 = (ulong)t;
      if (uVar13 != uVar12) {
        local_38 = &(this->D2_).succ_._M_h;
        do {
          puVar4 = (this->distance_).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar11 = (long)(this->distance_).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar4;
          uVar10 = uVar11;
          uVar9 = uVar15;
          if (uVar11 <= uVar15) goto LAB_00109289;
          if (puVar4[uVar15] != '?') break;
          this->front_ = uVar12 + 1;
          puVar5 = (this->queue_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar10 = (long)(this->queue_).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar5 >> 2;
          uVar9 = uVar12;
          if (uVar10 <= uVar12) goto LAB_00109289;
          uVar3 = puVar5[uVar12];
          uVar13 = (ulong)uVar3;
          uVar10 = uVar11;
          uVar9 = uVar13;
          if (uVar11 <= uVar13) goto LAB_00109289;
          if (puVar4[uVar13] < this->k_) {
            pvVar7 = Graph::successors(this->graph_,uVar3);
            puVar6 = (pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
            for (puVar14 = (pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                           ._M_impl.super__Vector_impl_data._M_start; puVar14 != puVar6;
                puVar14 = puVar14 + 1) {
              uVar9 = (ulong)*puVar14;
              puVar4 = (this->distance_).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar10 = (long)(this->distance_).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar4;
              if (uVar10 <= uVar9) goto LAB_00109289;
              if ((puVar4[uVar9] == '?') &&
                 (local_40 = *puVar14,
                 cVar8 = std::
                         _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         ::find(&(this->D1_).succ_._M_h,&local_40),
                 cVar8.
                 super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                 ._M_cur == (__node_type *)0x0)) {
                local_3c = *puVar14;
                cVar8 = std::
                        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        ::find(local_38,&local_3c);
                if (cVar8.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                    ._M_cur == (__node_type *)0x0) {
                  puVar4 = (this->distance_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
                  uVar10 = (long)(this->distance_).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar4;
                  uVar9 = uVar13;
                  if ((uVar10 <= uVar13) || (uVar9 = (ulong)*puVar14, uVar10 <= uVar9))
                  goto LAB_00109289;
                  puVar4[uVar9] = puVar4[uVar13] + '\x01';
                  uVar3 = *puVar14;
                  uVar9 = this->back_;
                  this->back_ = uVar9 + 1;
                  puVar5 = (this->queue_).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  uVar10 = (long)(this->queue_).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 2;
                  if (uVar10 <= uVar9) goto LAB_00109289;
                  puVar5[uVar9] = uVar3;
                }
              }
            }
          }
          uVar13 = this->back_;
          uVar12 = this->front_;
        } while (uVar13 != uVar12);
      }
      puVar4 = (this->distance_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar10 = (long)(this->distance_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar4;
      uVar9 = uVar15;
      if (uVar15 < uVar10) {
        bVar1 = puVar4[uVar15];
        bVar2 = this->k_;
        if (uVar13 != 0) {
          uVar13 = 0;
          do {
            puVar5 = (this->queue_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar10 = (long)(this->queue_).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)puVar5 >> 2;
            uVar9 = uVar13;
            if (uVar10 <= uVar13) goto LAB_00109289;
            uVar9 = (ulong)puVar5[uVar13];
            puVar4 = (this->distance_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar10 = (long)(this->distance_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish - (long)puVar4;
            if (uVar10 <= uVar9) goto LAB_00109289;
            puVar4[uVar9] = '?';
            uVar13 = uVar13 + 1;
          } while (uVar13 < this->back_);
        }
        return bVar1 <= bVar2;
      }
    }
  }
LAB_00109289:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9,
             uVar10);
}

Assistant:

bool ScalableKReach::bfs(vertex_t s, vertex_t t) const {
    back_ = 0;
    front_ = 0;
    distance_.at(s) = 0;
    queue_.at(back_++) = s;
    while (back_ != front_ && distance_.at(t) == INF8) {
        vertex_t cur = queue_.at(front_++);
        if (distance_.at(cur) >= k_) {
            continue;
        }
        for (const auto &nxt : graph_.successors(cur)) {
            if (distance_.at(nxt) == INF8 && !D1_.indexed(nxt) && !D2_.indexed(nxt)) {
                distance_.at(nxt) = distance_.at(cur) + 1;
                queue_.at(back_++) = nxt;
            }
        }
    }
    bool result = distance_.at(t) <= k_;
    for (size_t i = 0; i < back_; ++i) {
        distance_.at(queue_.at(i)) = INF8;
    }
    return result;
}